

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChDebugDrawer::drawLine
          (ChDebugDrawer *this,cbtVector3 *from,cbtVector3 *to,cbtVector3 *color)

{
  (**(code **)(*(long *)this->m_vis + 0x10))();
  return;
}

Assistant:

void drawLine(const cbtVector3& from, const cbtVector3& to, const cbtVector3& color) override {
        m_vis->DrawLine(ChVector<>(from.x(), from.y(), from.z()), ChVector<>(to.x(), to.y(), to.z()),
                        ChColor(color.x(), color.y(), color.z()));
    }